

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  int iVar1;
  pointer pLVar2;
  pointer pcVar3;
  cmGeneratorTarget *this_00;
  string *psVar4;
  cmLinkInterface *iface;
  long lVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar6;
  bool local_a6;
  bool local_a5;
  int index;
  pointer local_a0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68;
  
  pVar6 = AllocateLinkEntry(this,&dep->Item);
  index = pVar6.first._M_node._M_node[3]._M_color;
  lVar5 = (long)index;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = pLVar2 + lVar5;
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(&dep->Item);
    std::__cxx11::string::string((string *)&local_88,(string *)psVar4);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_98,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&(dep->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_68,&local_88,(cmListFileBacktrace *)&local_98);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&local_a0->Item,&local_68);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    std::__cxx11::string::~string((string *)&local_88);
    pLVar2[lVar5].Target = (dep->Item).Target;
    pLVar2[lVar5].Kind = SharedDep;
  }
  iVar1 = dep->DependerIndex;
  pcVar3 = (this->EntryConstraintGraph).
           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a5 = true;
  local_a6 = false;
  local_68.Value._M_dataplus._M_p = (pointer)0x0;
  local_68.Value._M_string_length = 0;
  local_a0 = (pointer)lVar5;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_68);
  std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
  emplace_back<int&,bool,bool,cmListFileBacktrace>
            ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar3 + iVar1),&index,&local_a5,
             &local_a6,(cmListFileBacktrace *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.Value._M_string_length);
  this_00 = pLVar2[(long)local_a0].Target;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    iface = cmGeneratorTarget::GetLinkInterface(this_00,&this->Config,this->Target);
    if (iface != (cmLinkInterface *)0x0) {
      FollowSharedDeps(this,index,iface,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(dep.Item);
  int index = lei.first->second;

  // Check if the target does not already has an entry.
  if (lei.second) {
    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[index];
    entry.Item = BT<std::string>(dep.Item.AsStr(), dep.Item.Backtrace);
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.Kind = LinkEntry::SharedDep;
  }

  // Get the link entry for this target.
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].emplace_back(
    index, true, false, cmListFileBacktrace());

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}